

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeRTASBuilderGetBuildPropertiesExp
          (ze_rtas_builder_exp_handle_t hBuilder,
          ze_rtas_builder_build_op_exp_desc_t *pBuildOpDescriptor,
          ze_rtas_builder_exp_properties_t *pProperties)

{
  ze_result_t zVar1;
  
  if (DAT_0010e108 != (code *)0x0) {
    zVar1 = (*DAT_0010e108)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderGetBuildPropertiesExp(
        ze_rtas_builder_exp_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_exp_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        ze_rtas_builder_exp_properties_t* pProperties   ///< [in,out] query result for builder properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetBuildPropertiesExp = context.zeDdiTable.RTASBuilderExp.pfnGetBuildPropertiesExp;
        if( nullptr != pfnGetBuildPropertiesExp )
        {
            result = pfnGetBuildPropertiesExp( hBuilder, pBuildOpDescriptor, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }